

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Str_t * Acb_GenerateInstance2(Vec_Ptr_t *vIns,Vec_Ptr_t *vOuts)

{
  Vec_Str_t *p;
  void *pvVar1;
  char *pcVar2;
  uint i;
  int i_00;
  
  p = Vec_StrAlloc(100);
  Vec_StrAppend(p,"  patch p0 (");
  for (i = 0; (int)i < vOuts->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(vOuts,i);
    pcVar2 = ",";
    if (i == 0) {
      pcVar2 = "";
    }
    Vec_StrPrintF(p,"%s .%s(t%d_%s)",pcVar2,pvVar1,(ulong)i,pvVar1);
  }
  for (i_00 = 0; i_00 < vIns->nSize; i_00 = i_00 + 1) {
    pvVar1 = Vec_PtrEntry(vIns,i_00);
    Vec_StrPrintF(p,", .%s(%s)",pvVar1,pvVar1);
  }
  Vec_StrAppend(p," );\n\n");
  Vec_StrPush(p,'\0');
  return p;
}

Assistant:

Vec_Str_t * Acb_GenerateInstance2( Vec_Ptr_t * vIns, Vec_Ptr_t * vOuts )
{
    char * pName; int i;
    Vec_Str_t * vStr = Vec_StrAlloc( 100 );
    Vec_StrAppend( vStr, "  patch p0 (" );
    Vec_PtrForEachEntry( char *, vOuts, pName, i )
        Vec_StrPrintF( vStr, "%s .%s(t%d_%s)", i ? ",":"", pName, i, pName );
    Vec_PtrForEachEntry( char *, vIns, pName, i )
        Vec_StrPrintF( vStr, ", .%s(%s)", pName, pName );
    Vec_StrAppend( vStr, " );\n\n" );
    Vec_StrPush( vStr, '\0' );
    return vStr;
}